

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Nblock(int g_a,int *nblock)

{
  long in_RSI;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer ndim;
  Integer aa;
  Integer *in_stack_000001a8;
  Integer in_stack_000001b0;
  int local_5c;
  undefined8 local_58 [7];
  Integer local_20;
  Integer local_18;
  long local_10;
  
  local_18 = (Integer)in_EDI;
  local_10 = in_RSI;
  pnga_nblock(in_stack_000001b0,in_stack_000001a8);
  local_20 = pnga_get_dimension(local_18);
  for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
    *(int *)(local_10 + ((local_20 - local_5c) + -1) * 4) = (int)local_58[local_5c];
  }
  return;
}

Assistant:

void NGA_Nblock(int g_a, int *nblock)
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    wnga_nblock(aa, _ga_work);
    ndim = wnga_get_dimension(aa);
    COPYF2C(_ga_work,nblock,ndim);
}